

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

iterator __thiscall
ska::detailv3::sherwood_v3_table<$a9d55d12$>::find
          (sherwood_v3_table<_a9d55d12_> *this,
          tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
          *key)

{
  EntryPointer psVar1;
  bool bVar2;
  ulong uVar3;
  char cVar4;
  EntryPointer psVar5;
  size_t seed;
  size_t local_28;
  
  local_28 = 0;
  slang::detail::
  HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
  ::apply(&local_28,key);
  uVar3 = ((long)(key->
                 super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                 ).
                 super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                 .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
                 super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl +
           (local_28 >> 2) + 0x9e3779b9 + local_28 * 0x40 ^ local_28) * -0x61c8864680b583eb >>
          ((this->hash_policy).shift & 0x3fU);
  if (-1 < this->entries[uVar3].distance_from_desired) {
    cVar4 = '\0';
    psVar5 = this->entries + uVar3;
    do {
      bVar2 = std::
              __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_3UL>
              ::__eq(key,&(psVar5->field_1).value.first);
      if (bVar2) {
        return (iterator)psVar5;
      }
      cVar4 = cVar4 + '\x01';
      psVar1 = psVar5 + 1;
      psVar5 = psVar5 + 1;
    } while (cVar4 <= psVar1->distance_from_desired);
  }
  return (iterator)(this->entries + this->num_slots_minus_one + (long)this->max_lookups);
}

Assistant:

iterator find(const FindKey & key)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer it = entries + ptrdiff_t(index);
        for (int8_t distance = 0; it->distance_from_desired >= distance; ++distance, ++it)
        {
            if (compares_equal(key, it->value))
                return { it };
        }
        return end();
    }